

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locdispnames.cpp
# Opt level: O1

int32_t uloc_getDisplayScriptInContext_63
                  (char *locale,char *displayLocale,UChar *dest,int32_t destCapacity,
                  UErrorCode *pErrorCode)

{
  int32_t iVar1;
  UErrorCode localStatus;
  char localeBuffer [628];
  
  if ((pErrorCode != (UErrorCode *)0x0) && (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR)) {
    if ((-1 < destCapacity) && (dest != (UChar *)0x0 || destCapacity == 0)) {
      localStatus = U_ZERO_ERROR;
      iVar1 = uloc_getScript_63(locale,localeBuffer,0x274,&localStatus);
      if (localStatus < U_ILLEGAL_ARGUMENT_ERROR && localStatus != U_STRING_NOT_TERMINATED_WARNING)
      {
        if (iVar1 != 0) {
          iVar1 = _getStringOrCopyKey("icudt63l-lang",displayLocale,"Scripts",(char *)0x0,
                                      localeBuffer,localeBuffer,dest,destCapacity,pErrorCode);
          return iVar1;
        }
        iVar1 = u_terminateUChars_63(dest,destCapacity,0,pErrorCode);
        return iVar1;
      }
    }
    *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
  }
  return 0;
}

Assistant:

U_INTERNAL int32_t U_EXPORT2
uloc_getDisplayScriptInContext(const char* locale,
                      const char* displayLocale,
                      UChar *dest, int32_t destCapacity,
                      UErrorCode *pErrorCode)
{
    return _getDisplayNameForComponent(locale, displayLocale, dest, destCapacity,
                    uloc_getScript, _kScripts, pErrorCode);
}